

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.h
# Opt level: O2

pair<BigInt,_long_long> * __thiscall
BigInt::divModValue(pair<BigInt,_long_long> *__return_storage_ptr__,BigInt *this,longlong val)

{
  long lVar1;
  ulong uVar2;
  uint uVar3;
  long lVar4;
  BigInt result;
  string num;
  BigInt local_80;
  BigInt local_60;
  string local_40;
  
  BigInt(&local_80,this);
  to_string_abi_cxx11_(&local_40,&local_80);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_80);
  BigInt(&local_80,this);
  uVar2 = (ulong)((long)local_80.vector_value.
                        super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)local_80.vector_value.
                       super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
                       super__Vector_impl_data._M_start) >> 3 & 0xffffffff;
  lVar1 = 0;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)(uint)uVar2 < 0) break;
    uVar3 = (uint)uVar2 & 0x7fffffff;
    lVar4 = lVar1 * base +
            local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
            super__Vector_impl_data._M_start[uVar3];
    lVar1 = lVar4 % val;
    local_80.vector_value.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] = lVar4 / val;
  }
  trim(&local_60,&local_80);
  BigInt(&__return_storage_ptr__->first,&local_60);
  __return_storage_ptr__->second = lVar1;
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_60);
  std::_Vector_base<long_long,_std::allocator<long_long>_>::~_Vector_base
            ((_Vector_base<long_long,_std::allocator<long_long>_> *)&local_80);
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

pair<BigInt, long long> divModValue(long long val) const { //! divide by val
        auto num = BigInt(*this).to_string();

        BigInt result((*this));
        long long remainder = 0;
        long long temp;
        for (auto i = static_cast<int>(result.vector_value.size() - 1); i >= 0; i--) {
            temp = (result.vector_value[i] + remainder * base);
            remainder = temp % val;
            result.vector_value[i] = temp / val;
        }
        pair<BigInt, long long> ret (result.trim(), remainder);
        return ret;
    }